

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_request_state(Curl_easy *data,_Bool *done)

{
  curl_off_t *pcVar1;
  connectdata *conn;
  char *pcVar2;
  char *__s;
  curl_off_t cVar3;
  undefined8 *puVar4;
  connectdata *pcVar5;
  void *pvVar6;
  unsigned_short uVar7;
  unsigned_short uVar8;
  CURLcode CVar9;
  CURLcode CVar10;
  curl_pp_transfer cVar11;
  __pid_t _Var12;
  smb_request *req;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  long lVar17;
  uint uVar18;
  smb_request *req_1;
  smb_request *psVar19;
  long lVar20;
  short sVar21;
  size_t upload_size;
  ulong uVar22;
  void *msg;
  smb_tree_disconnect msg_1;
  void *local_480;
  _Bool *local_478;
  smb_request *local_470;
  undefined1 local_464;
  undefined1 uStack_463;
  undefined1 local_462;
  undefined2 uStack_461;
  undefined1 uStack_45f;
  undefined1 uStack_45e;
  undefined1 uStack_45d;
  undefined1 uStack_45c;
  undefined1 uStack_45b;
  undefined1 uStack_45a;
  undefined2 uStack_459;
  char acStack_457 [3];
  undefined2 uStack_454;
  undefined1 uStack_452;
  undefined1 uStack_451;
  undefined1 uStack_450;
  undefined4 uStack_44f;
  undefined1 uStack_44b;
  undefined1 uStack_44a;
  undefined5 uStack_449;
  undefined1 uStack_444;
  undefined1 uStack_443;
  undefined2 uStack_442;
  int iStack_440;
  undefined1 uStack_43c;
  undefined8 uStack_43b;
  undefined2 local_433;
  char local_431 [1025];
  
  conn = data->conn;
  psVar19 = (data->req).p.smb;
  local_480 = (void *)0x0;
  if ((((data->state).field_0x746 & 2) != 0) && ((data->state).infilesize < 0)) {
    Curl_failf(data,"SMB upload needs to know the size up front");
    return CURLE_SEND_ERROR;
  }
  if (psVar19->state == SMB_REQUESTING) {
    pcVar2 = (conn->host).name;
    local_478 = done;
    local_470 = psVar19;
    sVar13 = strlen(pcVar2);
    __s = (char *)(conn->proto).rtspc.buf.toobig;
    sVar14 = strlen(__s);
    uVar22 = sVar14 + sVar13 + 10;
    if (0x400 < uVar22) {
      CVar9 = CURLE_FILESIZE_EXCEEDED;
      goto LAB_001532fe;
    }
    uStack_45e = 0;
    local_462 = 0;
    uStack_461 = 0;
    uStack_45f = 0;
    local_464 = 4;
    uStack_463 = 0xff;
    uStack_45d = 0;
    uStack_45c = 0;
    acStack_457[0] = '\0';
    uStack_459 = 0x5c5c;
    strcpy(acStack_457,pcVar2);
    sVar15 = strlen(pcVar2);
    (acStack_457 + sVar15)[0] = '\\';
    (acStack_457 + sVar15)[1] = '\0';
    strcpy(acStack_457 + sVar15 + 1,__s);
    sVar16 = strlen(__s);
    builtin_strncpy(acStack_457 + sVar16 + sVar15 + 2,"????",4);
    *(undefined2 *)(&uStack_451 + sVar16 + sVar15) = 0x3f;
    uStack_45b = (undefined1)uVar22;
    uStack_45a = (undefined1)(uVar22 >> 8);
    CVar9 = smb_send_message(data,'u',&local_464,sVar14 + sVar13 + 0x15);
    if (CVar9 != CURLE_OK) goto LAB_001532fe;
    ((data->req).p.imap)->transfer = PPTRANSFER_INFO;
    psVar19 = local_470;
    done = local_478;
  }
  CVar9 = smb_send_and_recv(data,&local_480);
  pvVar6 = local_480;
  if ((CVar9 != CURLE_OK) && (CVar9 != CURLE_AGAIN)) {
LAB_001532fe:
    Curl_conncontrol(conn,1);
    return CVar9;
  }
  CVar9 = CURLE_OK;
  if (local_480 == (void *)0x0) {
    return CURLE_OK;
  }
  switch(psVar19->state) {
  case SMB_TREE_CONNECT:
    if (*(int *)((long)local_480 + 9) == 0) {
      psVar19->tid = *(unsigned_short *)((long)local_480 + 0x1c);
      (conn->proto).ftpc.pp.sendbuf.toobig = 0;
      pcVar2 = ((data->req).p.file)->freepath;
      sVar13 = strlen(pcVar2);
      CVar10 = CURLE_FILESIZE_EXCEEDED;
      if (sVar13 + 1 < 0x401) {
        local_462 = 0;
        uStack_461 = 0;
        uStack_45f = 0;
        uStack_45c = 0;
        uStack_45b = 0;
        uStack_45a = 0;
        uStack_459 = 0;
        acStack_457[0] = '\0';
        acStack_457[1] = 0;
        acStack_457[2] = 0;
        uStack_43c = 0;
        uStack_43b = 0;
        uStack_450 = 0;
        uStack_44f = 0;
        uStack_44b = 0;
        uStack_44a = 0;
        uStack_449 = 0;
        local_464 = 0x18;
        uStack_463 = 0xff;
        uStack_45e = (undefined1)sVar13;
        uStack_45d = (undefined1)(sVar13 >> 8);
        uStack_444 = 7;
        uStack_443 = 0;
        uStack_442 = 0;
        uVar18 = *(uint *)&(data->state).field_0x744 >> 0x11 & 1;
        iStack_440 = uVar18 * 4 + 1;
        uStack_454 = 0;
        uStack_452 = 0;
        uStack_451 = (undefined1)((uVar18 - 2) * 0x40000000 >> 0x18);
        local_433 = (undefined2)(sVar13 + 1);
        strcpy(local_431,pcVar2);
        CVar10 = smb_send_message(data,0xa2,&local_464,sVar13 + 0x34);
      }
      cVar11 = PPTRANSFER_NONE;
      goto LAB_001537f2;
    }
    CVar10 = CURLE_REMOTE_FILE_NOT_FOUND;
    if (*(int *)((long)local_480 + 9) == 0x50001) {
      CVar10 = CURLE_REMOTE_ACCESS_DENIED;
    }
    psVar19->result = CVar10;
    break;
  case SMB_OPEN:
    if ((*(int *)((long)local_480 + 9) == 0) && (99 < (conn->proto).ftpc.pp.sendbuf.toobig)) {
      psVar19->fid = *(unsigned_short *)((long)local_480 + 0x2a);
      (data->req).offset = 0;
      if (((data->state).field_0x746 & 2) != 0) {
        cVar3 = (data->state).infilesize;
        (data->req).size = cVar3;
        Curl_pgrsSetUploadSize(data,cVar3);
        lVar20 = (data->req).size;
        lVar17 = (data->req).bytecount;
LAB_00153614:
        upload_size = lVar20 - lVar17;
        (conn->proto).ftpc.pp.sendbuf.toobig = 0;
        psVar19 = (data->req).p.smb;
        cVar3 = (data->req).offset;
        puVar4 = (undefined8 *)(data->conn->proto).ftpc.pp.response_time;
        if (0x7ffe < (long)upload_size) {
          upload_size = 0x7fff;
        }
        puVar4[4] = 0;
        puVar4[5] = 0;
        *(undefined4 *)(puVar4 + 8) = 0;
        puVar4[6] = 0;
        puVar4[7] = 0;
        puVar4[2] = 0;
        puVar4[3] = 0;
        *puVar4 = 0;
        puVar4[1] = 0;
        *(undefined2 *)((long)puVar4 + 0x24) = 0xff0e;
        *(unsigned_short *)((long)puVar4 + 0x29) = psVar19->fid;
        *(int *)((long)puVar4 + 0x2b) = (int)cVar3;
        *(int *)((long)puVar4 + 0x3d) = (int)((ulong)cVar3 >> 0x20);
        sVar21 = (short)upload_size;
        *(short *)((long)puVar4 + 0x39) = sVar21;
        *(undefined2 *)((long)puVar4 + 0x3b) = 0x40;
        *(short *)((long)puVar4 + 0x41) = sVar21 + 1;
        pcVar5 = data->conn;
        psVar19 = (data->req).p.smb;
        *puVar4 = 0;
        puVar4[1] = 0;
        *(undefined4 *)(puVar4 + 4) = 0;
        puVar4[2] = 0;
        puVar4[3] = 0;
        *(ushort *)((long)puVar4 + 2) = (sVar21 + 0x40U) * 0x100 | (ushort)(sVar21 + 0x40U) >> 8;
        *(undefined4 *)((long)puVar4 + 4) = 0x424d53ff;
        *(undefined1 *)(puVar4 + 1) = 0x2f;
        *(undefined1 *)((long)puVar4 + 0xd) = 0x18;
        *(undefined2 *)((long)puVar4 + 0xe) = 0x41;
        *(unsigned_short *)(puVar4 + 4) = (pcVar5->proto).smbc.uid;
        *(unsigned_short *)((long)puVar4 + 0x1c) = psVar19->tid;
        _Var12 = getpid();
        *(short *)(puVar4 + 2) = (short)((uint)_Var12 >> 0x10);
        *(short *)((long)puVar4 + 0x1e) = (short)_Var12;
        CVar10 = smb_send(data,0x44,upload_size);
        cVar11 = 4;
        goto LAB_001537f2;
      }
      lVar20 = *(long *)((long)local_480 + 0x5c);
      (data->req).size = lVar20;
      if (-1 < lVar20) {
        Curl_pgrsSetDownloadSize(data,lVar20);
        if (((data->set).field_0x8ca & 0x80) != 0) {
          (data->info).filetime = (*(long *)((long)pvVar6 + 0x48) + -0x19db1ded53e8000) / 10000000;
        }
LAB_00153732:
        (conn->proto).ftpc.pp.sendbuf.toobig = 0;
        cVar3 = (data->req).offset;
        uStack_452 = 0;
        uStack_451 = 0;
        uStack_450 = 0;
        uStack_44b = 0;
        uStack_44a = 0;
        local_462 = 0;
        uStack_461 = 0;
        acStack_457[2] = 0;
        uStack_454 = 0;
        local_464 = 0xc;
        uStack_463 = 0xff;
        uVar7 = ((data->req).p.smb)->fid;
        uStack_45f = (undefined1)uVar7;
        uStack_45e = (undefined1)(uVar7 >> 8);
        uStack_45d = (undefined1)cVar3;
        uStack_45c = (undefined1)((ulong)cVar3 >> 8);
        uStack_45b = (undefined1)((ulong)cVar3 >> 0x10);
        uStack_45a = (undefined1)((ulong)cVar3 >> 0x18);
        uStack_44f = (undefined4)((ulong)cVar3 >> 0x20);
        uStack_459 = 0x8000;
        acStack_457[0] = '\0';
        acStack_457[1] = 0x80;
        CVar10 = smb_send_message(data,'.',&local_464,0x1b);
        cVar11 = PPTRANSFER_NONE|PPTRANSFER_INFO;
        goto LAB_001537f2;
      }
      CVar10 = CURLE_WEIRD_SERVER_REPLY;
      goto LAB_001537a1;
    }
    CVar10 = CURLE_REMOTE_FILE_NOT_FOUND;
    if (*(int *)((long)local_480 + 9) == 0x50001) {
      CVar10 = CURLE_REMOTE_ACCESS_DENIED;
    }
    psVar19->result = CVar10;
  case SMB_CLOSE:
    (conn->proto).ftpc.pp.sendbuf.toobig = 0;
    local_462 = 0;
    local_464 = 0;
    uStack_463 = 0;
    CVar10 = smb_send_message(data,'q',&local_464,3);
    cVar11 = 6;
    goto LAB_001537f2;
  case SMB_DOWNLOAD:
    CVar10 = CURLE_RECV_ERROR;
    if ((*(int *)((long)local_480 + 9) != 0) || ((conn->proto).ftpc.pp.sendbuf.toobig < 0x32))
    goto LAB_001537a1;
    uVar7 = Curl_read16_le((uchar *)((long)local_480 + 0x2f));
    uVar8 = Curl_read16_le((uchar *)((long)pvVar6 + 0x31));
    if (uVar7 != 0) {
      uVar22 = (ulong)uVar7;
      if ((conn->proto).ftpc.pp.sendbuf.toobig < uVar22 + uVar8 + 4) {
        Curl_failf(data,"Invalid input packet");
      }
      else {
        CVar10 = Curl_client_write(data,1,(char *)((long)pvVar6 + (ulong)uVar8 + 4),uVar22);
        if (CVar10 == CURLE_OK) {
          pcVar1 = &(data->req).offset;
          *pcVar1 = *pcVar1 + uVar22;
          if ((short)uVar7 < 0) goto LAB_00153732;
          goto LAB_001537a5;
        }
      }
      goto LAB_001537a1;
    }
    goto LAB_001537a5;
  case SMB_UPLOAD:
    CVar10 = CURLE_UPLOAD_FAILED;
    if ((*(int *)((long)local_480 + 9) == 0) && (0x29 < (conn->proto).ftpc.pp.sendbuf.toobig)) {
      uVar7 = Curl_read16_le((uchar *)((long)local_480 + 0x29));
      lVar20 = (data->req).bytecount + (ulong)uVar7;
      (data->req).bytecount = lVar20;
      pcVar1 = &(data->req).offset;
      *pcVar1 = *pcVar1 + (ulong)uVar7;
      Curl_pgrsSetUploadCounter(data,lVar20);
      lVar20 = (data->req).size;
      lVar17 = (data->req).bytecount;
      if (lVar17 < lVar20) goto LAB_00153614;
      goto LAB_001537a5;
    }
LAB_001537a1:
    psVar19->result = CVar10;
LAB_001537a5:
    (conn->proto).ftpc.pp.sendbuf.toobig = 0;
    uStack_45d = 0;
    uStack_45c = 0;
    uStack_461 = 0;
    uStack_45f = 0;
    uStack_45e = 0;
    local_464 = 3;
    uVar7 = ((data->req).p.smb)->fid;
    uStack_463 = (undefined1)uVar7;
    local_462 = (undefined1)(uVar7 >> 8);
    CVar10 = smb_send_message(data,'\x04',&local_464,9);
    cVar11 = 5;
    goto LAB_001537f2;
  case SMB_TREE_DISCONNECT:
    CVar10 = psVar19->result;
    break;
  default:
    (conn->proto).ftpc.pp.sendbuf.toobig = 0;
    return CURLE_OK;
  }
  (conn->proto).ftpc.pp.sendbuf.toobig = 0;
  *done = true;
  cVar11 = 7;
LAB_001537f2:
  if (CVar10 == CURLE_OK) {
    ((data->req).p.imap)->transfer = cVar11;
  }
  else {
    Curl_conncontrol(conn,1);
    CVar9 = CVar10;
  }
  return CVar9;
}

Assistant:

static CURLcode smb_request_state(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  struct smb_request *req = data->req.p.smb;
  struct smb_header *h;
  struct smb_conn *smbc = &conn->proto.smbc;
  enum smb_req_state next_state = SMB_DONE;
  unsigned short len;
  unsigned short off;
  CURLcode result;
  void *msg = NULL;
  const struct smb_nt_create_response *smb_m;

  if(data->state.upload && (data->state.infilesize < 0)) {
    failf(data, "SMB upload needs to know the size up front");
    return CURLE_SEND_ERROR;
  }

  /* Start the request */
  if(req->state == SMB_REQUESTING) {
    result = smb_send_tree_connect(data);
    if(result) {
      connclose(conn, "SMB: failed to send tree connect message");
      return result;
    }

    request_state(data, SMB_TREE_CONNECT);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(data, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(req->state) {
  case SMB_TREE_CONNECT:
    if(h->status) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      break;
    }
    req->tid = smb_swap16(h->tid);
    next_state = SMB_OPEN;
    break;

  case SMB_OPEN:
    if(h->status || smbc->got < sizeof(struct smb_nt_create_response)) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      next_state = SMB_TREE_DISCONNECT;
      break;
    }
    smb_m = (const struct smb_nt_create_response*) msg;
    req->fid = smb_swap16(smb_m->fid);
    data->req.offset = 0;
    if(data->state.upload) {
      data->req.size = data->state.infilesize;
      Curl_pgrsSetUploadSize(data, data->req.size);
      next_state = SMB_UPLOAD;
    }
    else {
      data->req.size = smb_swap64(smb_m->end_of_file);
      if(data->req.size < 0) {
        req->result = CURLE_WEIRD_SERVER_REPLY;
        next_state = SMB_CLOSE;
      }
      else {
        Curl_pgrsSetDownloadSize(data, data->req.size);
        if(data->set.get_filetime)
          get_posix_time(&data->info.filetime, smb_m->last_change_time);
        next_state = SMB_DOWNLOAD;
      }
    }
    break;

  case SMB_DOWNLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 14) {
      req->result = CURLE_RECV_ERROR;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 11);
    off = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 13);
    if(len > 0) {
      if(off + sizeof(unsigned int) + len > smbc->got) {
        failf(data, "Invalid input packet");
        result = CURLE_RECV_ERROR;
      }
      else
        result = Curl_client_write(data, CLIENTWRITE_BODY,
                                   (char *)msg + off + sizeof(unsigned int),
                                   len);
      if(result) {
        req->result = result;
        next_state = SMB_CLOSE;
        break;
      }
    }
    data->req.offset += len;
    next_state = (len < MAX_PAYLOAD_SIZE) ? SMB_CLOSE : SMB_DOWNLOAD;
    break;

  case SMB_UPLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 6) {
      req->result = CURLE_UPLOAD_FAILED;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 5);
    data->req.bytecount += len;
    data->req.offset += len;
    Curl_pgrsSetUploadCounter(data, data->req.bytecount);
    if(data->req.bytecount >= data->req.size)
      next_state = SMB_CLOSE;
    else
      next_state = SMB_UPLOAD;
    break;

  case SMB_CLOSE:
    /* We do not care if the close failed, proceed to tree disconnect anyway */
    next_state = SMB_TREE_DISCONNECT;
    break;

  case SMB_TREE_DISCONNECT:
    next_state = SMB_DONE;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  switch(next_state) {
  case SMB_OPEN:
    result = smb_send_open(data);
    break;

  case SMB_DOWNLOAD:
    result = smb_send_read(data);
    break;

  case SMB_UPLOAD:
    result = smb_send_write(data);
    break;

  case SMB_CLOSE:
    result = smb_send_close(data);
    break;

  case SMB_TREE_DISCONNECT:
    result = smb_send_tree_disconnect(data);
    break;

  case SMB_DONE:
    result = req->result;
    *done = true;
    break;

  default:
    break;
  }

  if(result) {
    connclose(conn, "SMB: failed to send message");
    return result;
  }

  request_state(data, next_state);

  return CURLE_OK;
}